

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void av1_setup_frame_buf_refs(AV1_COMMON *cm)

{
  RefCntBuffer *pRVar1;
  long lVar2;
  RefCntBuffer *pRVar3;
  
  pRVar1 = cm->cur_frame;
  pRVar1->order_hint = (cm->current_frame).order_hint;
  pRVar1->display_order_hint = (cm->current_frame).display_order_hint;
  pRVar1->pyramid_level = (cm->current_frame).pyramid_level;
  pRVar1->filter_level[0] = -1;
  pRVar1->filter_level[1] = -1;
  lVar2 = 0;
  do {
    if ((long)cm->remapped_ref_idx[lVar2] == -1) {
      pRVar3 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar3 = cm->ref_frame_map[cm->remapped_ref_idx[lVar2]];
    }
    if (pRVar3 != (RefCntBuffer *)0x0) {
      pRVar1->ref_order_hints[lVar2] = pRVar3->order_hint;
      pRVar1->ref_display_order_hint[lVar2] = pRVar3->display_order_hint;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  return;
}

Assistant:

void av1_setup_frame_buf_refs(AV1_COMMON *cm) {
  cm->cur_frame->order_hint = cm->current_frame.order_hint;
  cm->cur_frame->display_order_hint = cm->current_frame.display_order_hint;
  cm->cur_frame->pyramid_level = cm->current_frame.pyramid_level;
  cm->cur_frame->filter_level[0] = -1;
  cm->cur_frame->filter_level[1] = -1;
  MV_REFERENCE_FRAME ref_frame;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (buf != NULL) {
      cm->cur_frame->ref_order_hints[ref_frame - LAST_FRAME] = buf->order_hint;
      cm->cur_frame->ref_display_order_hint[ref_frame - LAST_FRAME] =
          buf->display_order_hint;
    }
  }
}